

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

ssize_t __thiscall
lan::db::str_find_first_not_of(db *this,string *target,string *content,size_t spoint)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  register_t i;
  ulong uVar4;
  db *this_00;
  bool bVar5;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  db_bits *local_50;
  db_bit *local_40;
  
  if (spoint < content->_M_string_length) {
    do {
      cVar1 = (content->_M_dataplus)._M_p[spoint];
      pcVar2 = (target->_M_dataplus)._M_p;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + target->_M_string_length);
      if (local_68 == 0) {
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if ((char)*local_70 != cVar1) {
          uVar3 = 1;
          do {
            uVar4 = uVar3;
            if (local_68 == uVar4) break;
            uVar3 = uVar4 + 1;
          } while (*(char *)((long)local_70 + uVar4) != cVar1);
          bVar5 = uVar4 < local_68;
        }
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (!bVar5) {
        return spoint;
      }
      pcVar2 = (content->_M_dataplus)._M_p;
      if (pcVar2[spoint] == '\"') {
        this_00 = (db *)&local_50;
        local_50 = (db_bits *)&stack0xffffffffffffffc0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + content->_M_string_length);
        spoint = str_get_str_end(this_00,(string *)&local_50,spoint + 1);
        if (local_50 != (db_bits *)&stack0xffffffffffffffc0) {
          operator_delete(local_50,(ulong)((long)&(local_40->key)._M_dataplus._M_p + 1));
        }
      }
      spoint = spoint + 1;
    } while (spoint < content->_M_string_length);
  }
  return -1;
}

Assistant:

ssize_t db::str_find_first_not_of(std::string const target, const std::string content, size_t spoint){
            for(register_t i = spoint ; i < content.length() ; i ++){
                if(!str_compare(content.data()[i] ,target))
                    return i;
                if(content[i] == '\"')
                    i = str_get_str_end(content, i+1);
            } return -1;
        }